

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_multi_statemach(Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  _Bool local_39;
  pingpong *ppStack_38;
  _Bool ssldone;
  smtp_conn *smtpc;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  smtpc = (smtp_conn *)data->conn;
  ppStack_38 = (pingpong *)&((connectdata *)smtpc)->proto;
  p_Stack_20 = done;
  done_local = (_Bool *)data;
  if (((((connectdata *)smtpc)->handler->flags & 1) != 0) &&
     ((*(byte *)((long)&((connectdata *)smtpc)->proto + 0xd0) & 1) == 0)) {
    local_39 = false;
    CVar1 = Curl_conn_connect(data,0,false,&local_39);
    *(byte *)&ppStack_38[1].response.tv_usec =
         (byte)ppStack_38[1].response.tv_usec & 0xfe | local_39 & 1U;
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((ppStack_38[1].response.tv_usec & 1) == 0) {
      return CURLE_OK;
    }
  }
  conn._4_4_ = 0;
  CVar1 = Curl_pp_statemach((Curl_easy *)done_local,ppStack_38,false,false);
  *p_Stack_20 = (int)ppStack_38[1].sendsize == 0;
  return CVar1;
}

Assistant:

static CURLcode smtp_multi_statemach(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  if((conn->handler->flags & PROTOPT_SSL) && !smtpc->ssldone) {
    bool ssldone = FALSE;
    result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
    smtpc->ssldone = ssldone;
    if(result || !smtpc->ssldone)
      return result;
  }

  result = Curl_pp_statemach(data, &smtpc->pp, FALSE, FALSE);
  *done = (smtpc->state == SMTP_STOP) ? TRUE : FALSE;

  return result;
}